

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_8::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  Iterator *pIVar1;
  IteratorWrapper *in_RSI;
  TwoLevelIterator *in_RDI;
  IteratorWrapper *in_stack_ffffffffffffffd8;
  Iterator *in_stack_ffffffffffffffe8;
  
  pIVar1 = IteratorWrapper::iter(&in_RDI->data_iter_);
  if (pIVar1 != (Iterator *)0x0) {
    IteratorWrapper::status(in_stack_ffffffffffffffd8);
    SaveError(in_RDI,(Status *)in_stack_ffffffffffffffd8);
    Status::~Status((Status *)in_RDI);
  }
  IteratorWrapper::Set(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}